

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall fmt::v7::format_int::format_unsigned<unsigned_int>(format_int *this,uint value)

{
  format_decimal_result<char_*> fVar1;
  
  fVar1 = detail::format_decimal<char,unsigned_int>(this->buffer_,value,0x15);
  return fVar1.begin;
}

Assistant:

char* format_unsigned(UInt value) {
    auto n = static_cast<detail::uint32_or_64_or_128_t<UInt>>(value);
    return detail::format_decimal(buffer_, n, buffer_size - 1).begin;
  }